

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickrst_sse4.c
# Opt level: O0

void av1_compute_stats_highbd_sse4_1
               (int wiener_win,uint8_t *dgd8,uint8_t *src8,int16_t *dgd_avg,int16_t *src_avg,
               int h_start,int h_end,int v_start,int v_end,int dgd_stride,int src_stride,int64_t *M,
               int64_t *H,aom_bit_depth_t bit_depth)

{
  int in_EDI;
  int in_stack_0000007c;
  int16_t *in_stack_00000080;
  int16_t *in_stack_00000088;
  uint8_t *in_stack_00000090;
  uint8_t *in_stack_00000098;
  int in_stack_000000a4;
  undefined4 in_stack_000000dc;
  int64_t *in_stack_000000e0;
  aom_bit_depth_t in_stack_000000e8;
  int in_stack_00002090;
  int in_stack_00002094;
  int in_stack_00002098;
  int in_stack_0000209c;
  uint8_t *in_stack_000020a0;
  uint8_t *in_stack_000020a8;
  int in_stack_000020c0;
  int in_stack_000020c8;
  int64_t *in_stack_000020d0;
  int64_t *in_stack_000020d8;
  aom_bit_depth_t in_stack_000020e0;
  int in_stack_00005830;
  int in_stack_00005834;
  int in_stack_00005838;
  int in_stack_0000583c;
  uint8_t *in_stack_00005840;
  uint8_t *in_stack_00005848;
  int in_stack_00005860;
  int in_stack_00005868;
  int64_t *in_stack_00005870;
  int64_t *in_stack_00005878;
  aom_bit_depth_t in_stack_00005880;
  
  if (in_EDI == 7) {
    compute_stats_highbd_win7_opt_sse4_1
              (in_stack_00005848,in_stack_00005840,in_stack_0000583c,in_stack_00005838,
               in_stack_00005834,in_stack_00005830,in_stack_00005860,in_stack_00005868,
               in_stack_00005870,in_stack_00005878,in_stack_00005880);
  }
  else if (in_EDI == 5) {
    compute_stats_highbd_win5_opt_sse4_1
              (in_stack_000020a8,in_stack_000020a0,in_stack_0000209c,in_stack_00002098,
               in_stack_00002094,in_stack_00002090,in_stack_000020c0,in_stack_000020c8,
               in_stack_000020d0,in_stack_000020d8,in_stack_000020e0);
  }
  else {
    av1_compute_stats_highbd_c
              (in_stack_000000a4,in_stack_00000098,in_stack_00000090,in_stack_00000088,
               in_stack_00000080,in_stack_0000007c,v_end,dgd_stride,src_stride,(int)M,(int)H,
               (int64_t *)CONCAT44(in_stack_000000dc,bit_depth),in_stack_000000e0,in_stack_000000e8)
    ;
  }
  return;
}

Assistant:

void av1_compute_stats_highbd_sse4_1(int wiener_win, const uint8_t *dgd8,
                                     const uint8_t *src8, int16_t *dgd_avg,
                                     int16_t *src_avg, int h_start, int h_end,
                                     int v_start, int v_end, int dgd_stride,
                                     int src_stride, int64_t *M, int64_t *H,
                                     aom_bit_depth_t bit_depth) {
  if (wiener_win == WIENER_WIN) {
    (void)dgd_avg;
    (void)src_avg;
    compute_stats_highbd_win7_opt_sse4_1(dgd8, src8, h_start, h_end, v_start,
                                         v_end, dgd_stride, src_stride, M, H,
                                         bit_depth);
  } else if (wiener_win == WIENER_WIN_CHROMA) {
    (void)dgd_avg;
    (void)src_avg;
    compute_stats_highbd_win5_opt_sse4_1(dgd8, src8, h_start, h_end, v_start,
                                         v_end, dgd_stride, src_stride, M, H,
                                         bit_depth);
  } else {
    av1_compute_stats_highbd_c(wiener_win, dgd8, src8, dgd_avg, src_avg,
                               h_start, h_end, v_start, v_end, dgd_stride,
                               src_stride, M, H, bit_depth);
  }
}